

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_bit_nary(jit_State *J,RecordFFData *rd)

{
  uint32_t uVar1;
  TRef TVar2;
  TRef TVar3;
  TRef *pTVar4;
  ulong uVar5;
  
  TVar2 = lj_opt_narrow_tobit(J,*J->base);
  pTVar4 = J->base;
  TVar3 = pTVar4[1];
  if (TVar3 != 0) {
    uVar1 = rd->data;
    uVar5 = 2;
    do {
      TVar3 = lj_opt_narrow_tobit(J,TVar3);
      (J->fold).ins.field_0.ot = (ushort)(uVar1 << 8) | 0x13;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
      TVar2 = lj_opt_fold(J);
      pTVar4 = J->base;
      TVar3 = pTVar4[uVar5];
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (TVar3 != 0);
  }
  *pTVar4 = TVar2;
  return;
}

Assistant:

static void LJ_FASTCALL recff_bit_nary(jit_State *J, RecordFFData *rd)
{
  TRef tr = lj_opt_narrow_tobit(J, J->base[0]);
  uint32_t op = rd->data;
  BCReg i;
  for (i = 1; J->base[i] != 0; i++)
    tr = emitir(IRTI(op), tr, lj_opt_narrow_tobit(J, J->base[i]));
  J->base[0] = tr;
}